

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O2

handle pybind11::detail::
       eigen_array_cast<pybind11::detail::EigenProps<Eigen::Matrix<double,1,1,1,1,1>>>
                 (Type *src,handle base,bool writeable)

{
  array aVar1;
  array a;
  array local_80;
  _Vector_base<long,_std::allocator<long>_> local_78;
  _Vector_base<long,_std::allocator<long>_> local_60;
  long local_48 [2];
  initializer_list<long> local_38;
  initializer_list<long> local_28;
  
  array::array(&a);
  local_28._M_array = local_48 + 1;
  local_48[1] = 1;
  local_28._M_len = 1;
  any_container<long>::any_container<long,void>((any_container<long> *)&local_60,&local_28);
  local_38._M_array = local_48;
  local_48[0] = 8;
  local_38._M_len = 1;
  any_container<long>::any_container<long,void>((any_container<long> *)&local_78,&local_38);
  array::array<double>
            (&local_80,(ShapeContainer *)&local_60,(StridesContainer *)&local_78,(double *)src,base)
  ;
  pybind11::object::operator=((object *)&a,(object *)&local_80);
  pybind11::object::~object((object *)&local_80);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_78);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_60);
  aVar1 = a;
  if (!writeable) {
    *(byte *)((long)a.super_buffer.super_object.super_handle.m_ptr + 0x41) =
         *(byte *)((long)a.super_buffer.super_object.super_handle.m_ptr + 0x41) & 0xfb;
  }
  a.super_buffer.super_object.super_handle.m_ptr = (buffer)(object)0x0;
  pybind11::object::~object((object *)&a);
  return (handle)(PyObject *)aVar1.super_buffer.super_object.super_handle.m_ptr;
}

Assistant:

handle eigen_array_cast(typename props::Type const &src, handle base = handle(), bool writeable = true) {
    constexpr ssize_t elem_size = sizeof(typename props::Scalar);
    array a;
    if (props::vector)
        a = array({ src.size() }, { elem_size * src.innerStride() }, src.data(), base);
    else
        a = array({ src.rows(), src.cols() }, { elem_size * src.rowStride(), elem_size * src.colStride() },
                  src.data(), base);

    if (!writeable)
        array_proxy(a.ptr())->flags &= ~detail::npy_api::NPY_ARRAY_WRITEABLE_;

    return a.release();
}